

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CI_String.hpp
# Opt level: O0

int OpenMD::Utils::ci_char_traits::compare(char *s1_,char *s2_,size_t count_)

{
  int iVar1;
  int iVar2;
  long in_RDX;
  char *in_RSI;
  char *in_RDI;
  long local_20;
  char *local_18;
  char *local_10;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  while( true ) {
    if (local_20 == 0) {
      return 0;
    }
    iVar1 = toupper((int)*local_10);
    iVar2 = toupper((int)*local_18);
    if (iVar1 < iVar2) break;
    iVar1 = toupper((int)*local_10);
    iVar2 = toupper((int)*local_18);
    if (iVar2 < iVar1) {
      return 1;
    }
    local_10 = local_10 + 1;
    local_18 = local_18 + 1;
    local_20 = local_20 + -1;
  }
  return -1;
}

Assistant:

static int compare(const char* s1_, const char* s2_,
                       std::size_t count_) noexcept {
      while (count_-- != 0) {
        if (std::toupper(*s1_) < std::toupper(*s2_)) return -1;
        if (std::toupper(*s1_) > std::toupper(*s2_)) return 1;

        ++s1_;
        ++s2_;
      }

      return 0;
    }